

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_glossary_gnu(FILE *fp,void **argtable)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  ushort **ppuVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  byte *pbVar10;
  ulong uVar11;
  int iVar12;
  char syntax [200];
  char *in_stack_fffffffffffffee8;
  uint local_f8;
  undefined1 local_f4;
  
  pbVar10 = (byte *)*argtable;
  if ((*pbVar10 & 1) == 0) {
    lVar5 = 0;
    do {
      if (*(long *)(pbVar10 + 0x20) != 0) {
        memset(&local_f8,0,200);
        if (*(char **)(pbVar10 + 0x10) != (char *)0x0 && *(size_t *)(pbVar10 + 8) == 0) {
          local_f8 = 0x20202020;
          local_f4 = 0;
        }
        __s = *(char **)(pbVar10 + 0x20);
        arg_cat_optionv((char *)&local_f8,*(size_t *)(pbVar10 + 8),*(char **)(pbVar10 + 0x10),
                        *(char **)(pbVar10 + 0x18),(char *)(ulong)(*pbVar10 & 4),0x10b654,
                        in_stack_fffffffffffffee8);
        sVar1 = strlen((char *)&local_f8);
        if (0x19 < sVar1) {
          fprintf((FILE *)fp,"  %-25s %s\n",&local_f8,"");
          local_f8 = local_f8 & 0xffffff00;
        }
        fprintf((FILE *)fp,"  %-25s ",&local_f8);
        pcVar2 = (char *)strlen(__s);
        in_stack_fffffffffffffee8 = pcVar2;
        if ((int)pcVar2 != 0) {
          uVar7 = 0;
          ppuVar3 = __ctype_b_loc();
          in_stack_fffffffffffffee8 = pcVar2;
          do {
            iVar12 = 1 - uVar7;
            iVar8 = (int)pcVar2 - uVar7;
            uVar6 = iVar8 + 2;
            uVar9 = iVar8 + 1;
            do {
              uVar4 = uVar9;
              uVar11 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
              iVar12 = iVar12 + -1;
              uVar6 = uVar6 - 1;
              uVar9 = uVar4 - 1;
            } while ((*(byte *)((long)*ppuVar3 + (long)__s[uVar11] * 2 + 1) & 0x20) != 0);
            if (0x33 < uVar6) {
              uVar6 = 0x34;
            }
            uVar9 = uVar6 - iVar12;
            uVar7 = -iVar12;
            if ((uVar7 < uVar9) && (0x34 < uVar6)) {
              if (0x33 < uVar4) {
                uVar4 = 0x34;
              }
              do {
                uVar4 = uVar4 - 1;
                if (((*(byte *)((long)*ppuVar3 + (long)__s[uVar9] * 2 + 1) & 0x20) != 0) ||
                   (uVar9 = uVar9 - 1, uVar9 <= uVar7)) break;
              } while (0x34 < uVar4);
            }
            uVar6 = uVar9 - 1;
            pcVar2 = (char *)(ulong)uVar6;
            if (uVar7 < uVar6) {
              do {
                fputc((int)__s[uVar11],(FILE *)fp);
                uVar11 = uVar11 + 1;
              } while (uVar11 < uVar6);
              uVar7 = (uint)uVar11;
            }
            fputc(10,(FILE *)fp);
            if (uVar9 < (uint)in_stack_fffffffffffffee8) {
              iVar8 = 0x1c;
              pcVar2 = in_stack_fffffffffffffee8;
              do {
                fputc(0x20,(FILE *)fp);
                iVar8 = iVar8 + -1;
                in_stack_fffffffffffffee8 = pcVar2;
              } while (iVar8 != 0);
            }
          } while (uVar7 < (uint)pcVar2);
        }
      }
      pbVar10 = (byte *)argtable[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while ((*pbVar10 & 1) == 0);
  }
  fputc(10,(FILE *)fp);
  return;
}

Assistant:

void arg_print_glossary_gnu(FILE * fp, void * *argtable ) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int tabindex;

	for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
		if (table[tabindex]->glossary) {
			char syntax[200] = "";
			const char * shortopts = table[tabindex]->shortopts;
			const char * longopts  = table[tabindex]->longopts;
			const char * datatype  = table[tabindex]->datatype;
			const char * glossary  = table[tabindex]->glossary;

			if ( !shortopts && longopts ) {
				/* Indent trailing line by 4 spaces... */
				memset( syntax, ' ', 4 );
				*(syntax + 4) = '\0';
			}

			arg_cat_optionv(syntax,
							sizeof(syntax),
							shortopts,
							longopts,
							datatype,
							table[tabindex]->flag & ARG_HASOPTVALUE,
							", ");

			/* If syntax fits not into column, print glossary in new line... */
			if ( strlen(syntax) > 25 ) {
				fprintf( fp, "  %-25s %s\n", syntax, "" );
				*syntax = '\0';
			}

			fprintf( fp, "  %-25s ", syntax );
			arg_print_formatted( fp, 28, 79, glossary );
		}
	} /* for each table entry */

	fputc( '\n', fp );
}